

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O0

void on_receive(quicly_stream_t *stream,size_t off,void *src,size_t len)

{
  int iVar1;
  quicly_conn_t *in_RCX;
  long in_RDI;
  ptls_iovec_t pVar2;
  ptls_iovec_t input;
  size_t in_stack_ffffffffffffffc8;
  quicly_stream_t *pqVar3;
  undefined1 in_stack_ffffffffffffffd0 [16];
  
  pqVar3 = in_stack_ffffffffffffffd0._0_8_;
  iVar1 = quicly_streambuf_ingress_receive
                    ((quicly_stream_t *)in_RCX,in_stack_ffffffffffffffd0._8_8_,pqVar3,
                     in_stack_ffffffffffffffc8);
  if (iVar1 == 0) {
    pVar2 = quicly_streambuf_ingress_get(pqVar3);
    iVar1 = is_server();
    if (iVar1 == 0) {
      fwrite(pVar2.base,1,pVar2.len,_stdout);
      fflush(_stdout);
      iVar1 = quicly_recvstate_transfer_complete((quicly_recvstate_t *)(in_RDI + 0x78));
      pqVar3 = (quicly_stream_t *)pVar2.base;
      if (iVar1 != 0) {
        quicly_close(in_RCX,pVar2.len._4_4_,(char *)pqVar3);
      }
    }
    else {
      iVar1 = quicly_sendstate_is_open((quicly_sendstate_t *)(in_RDI + 0x18));
      pqVar3 = (quicly_stream_t *)pVar2.base;
      if ((iVar1 != 0) && ((void *)pVar2.len != (void *)0x0)) {
        quicly_streambuf_egress_write((quicly_stream_t *)in_RCX,(void *)pVar2.len,(size_t)pqVar3);
        iVar1 = quicly_recvstate_transfer_complete((quicly_recvstate_t *)(in_RDI + 0x78));
        if (iVar1 != 0) {
          quicly_streambuf_egress_shutdown(pqVar3);
        }
      }
    }
    quicly_streambuf_ingress_shift(pqVar3,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static void on_receive(quicly_stream_t *stream, size_t off, const void *src, size_t len)
{
    /* read input to receive buffer */
    if (quicly_streambuf_ingress_receive(stream, off, src, len) != 0)
        return;

    /* obtain contiguous bytes from the receive buffer */
    ptls_iovec_t input = quicly_streambuf_ingress_get(stream);

    if (is_server()) {
        /* server: echo back to the client */
        if (quicly_sendstate_is_open(&stream->sendstate) && (input.len > 0)) {
            quicly_streambuf_egress_write(stream, input.base, input.len);
            /* shutdown the stream after echoing all data */
            if (quicly_recvstate_transfer_complete(&stream->recvstate))
                quicly_streambuf_egress_shutdown(stream);
        }
    } else {
        /* client: print to stdout */
        fwrite(input.base, 1, input.len, stdout);
        fflush(stdout);
        /* initiate connection close after receiving all data */
        if (quicly_recvstate_transfer_complete(&stream->recvstate))
            quicly_close(stream->conn, 0, "");
    }

    /* remove used bytes from receive buffer */
    quicly_streambuf_ingress_shift(stream, input.len);
}